

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

void PushInterval(CostManager *manager,int64_t distance_cost,int position,int len)

{
  long lVar1;
  long *plVar2;
  uint uVar3;
  int iVar4;
  long cost_00;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  int end_original;
  int start_new;
  int64_t cost;
  int end;
  int start;
  int64_t cost_tmp;
  int k;
  int j;
  int kSkipDistance;
  CostCacheInterval *cost_cache_intervals;
  CostInterval *interval_next;
  CostInterval *interval;
  size_t i;
  uint in_stack_ffffffffffffff88;
  int iVar5;
  int iVar6;
  uint in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int iVar7;
  CostManager *in_stack_ffffffffffffffb0;
  int local_40;
  long *local_28;
  ulong local_20;
  
  local_28 = (long *)*in_RDI;
  lVar1 = in_RDI[2];
  local_40 = in_EDX;
  if (in_ECX < 10) {
    for (; local_40 < in_EDX + in_ECX; local_40 = local_40 + 1) {
      if (in_RSI + in_RDI[(long)(local_40 - in_EDX) + 4] <
          *(long *)(in_RDI[0x1003] + (long)local_40 * 8)) {
        *(long *)(in_RDI[0x1003] + (long)local_40 * 8) =
             in_RSI + in_RDI[(long)(local_40 - in_EDX) + 4];
        *(short *)(in_RDI[0x1004] + (long)local_40 * 2) = (short)(local_40 - in_EDX) + 1;
      }
    }
  }
  else {
    local_20 = 0;
    while( true ) {
      uVar3 = in_stack_ffffffffffffff94 & 0xffffff;
      if (local_20 < (ulong)in_RDI[3]) {
        uVar3 = CONCAT13(*(int *)(lVar1 + local_20 * 0x10 + 8) < in_ECX,
                         (int3)in_stack_ffffffffffffff94);
      }
      in_stack_ffffffffffffff94 = uVar3;
      if ((char)(in_stack_ffffffffffffff94 >> 0x18) == '\0') break;
      iVar5 = in_ECX;
      if (*(int *)(lVar1 + local_20 * 0x10 + 0xc) <= in_ECX) {
        iVar5 = *(int *)(lVar1 + local_20 * 0x10 + 0xc);
      }
      iVar4 = in_EDX + iVar5;
      cost_00 = in_RSI + *(long *)(lVar1 + local_20 * 0x10);
      iVar6 = in_EDX;
      iVar7 = in_EDX + *(int *)(lVar1 + local_20 * 0x10 + 8);
      plVar2 = local_28;
      do {
        while( true ) {
          do {
            local_28 = plVar2;
            uVar3 = in_stack_ffffffffffffff88 & 0xffffff;
            if (local_28 != (long *)0x0) {
              uVar3 = CONCAT13((int)local_28[1] < iVar4,(int3)in_stack_ffffffffffffff88);
            }
            in_stack_ffffffffffffff88 = uVar3;
            if ((char)(in_stack_ffffffffffffff88 >> 0x18) == '\0') goto LAB_001a15a2;
            plVar2 = (long *)local_28[4];
          } while (*(int *)((long)local_28 + 0xc) <= iVar7);
          if (*local_28 <= cost_00) break;
          if ((int)local_28[1] < iVar7) {
            if (iVar4 < *(int *)((long)local_28 + 0xc)) {
              in_stack_ffffffffffffff98 = *(int *)((long)local_28 + 0xc);
              *(int *)((long)local_28 + 0xc) = iVar7;
              InsertInterval(in_stack_ffffffffffffffb0,(CostInterval *)CONCAT44(iVar7,iVar4),cost_00
                             ,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                             in_stack_ffffffffffffff94);
              local_28 = (long *)local_28[4];
              goto LAB_001a15a2;
            }
            *(int *)((long)local_28 + 0xc) = iVar7;
          }
          else {
            if (iVar4 < *(int *)((long)local_28 + 0xc)) {
              *(int *)(local_28 + 1) = iVar4;
              goto LAB_001a15a2;
            }
            PopInterval((CostManager *)CONCAT44(in_stack_ffffffffffffff94,iVar6),
                        (CostInterval *)CONCAT44(iVar5,in_stack_ffffffffffffff88));
          }
        }
        in_stack_ffffffffffffff9c = *(int *)((long)local_28 + 0xc);
        InsertInterval(in_stack_ffffffffffffffb0,(CostInterval *)CONCAT44(iVar7,iVar4),cost_00,
                       in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94
                      );
        iVar7 = in_stack_ffffffffffffff9c;
      } while (in_stack_ffffffffffffff9c < iVar4);
LAB_001a15a2:
      InsertInterval(in_stack_ffffffffffffffb0,(CostInterval *)CONCAT44(iVar7,iVar4),cost_00,
                     in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void PushInterval(CostManager* const manager,
                                     int64_t distance_cost, int position,
                                     int len) {
  size_t i;
  CostInterval* interval = manager->head;
  CostInterval* interval_next;
  const CostCacheInterval* const cost_cache_intervals =
      manager->cache_intervals;
  // If the interval is small enough, no need to deal with the heavy
  // interval logic, just serialize it right away. This constant is empirical.
  const int kSkipDistance = 10;

  if (len < kSkipDistance) {
    int j;
    for (j = position; j < position + len; ++j) {
      const int k = j - position;
      int64_t cost_tmp;
      assert(k >= 0 && k < MAX_LENGTH);
      cost_tmp = distance_cost + manager->cost_cache[k];

      if (manager->costs[j] > cost_tmp) {
        manager->costs[j] = cost_tmp;
        manager->dist_array[j] = k + 1;
      }
    }
    return;
  }

  for (i = 0; i < manager->cache_intervals_size &&
              cost_cache_intervals[i].start < len;
       ++i) {
    // Define the intersection of the ith interval with the new one.
    int start = position + cost_cache_intervals[i].start;
    const int end = position + (cost_cache_intervals[i].end > len
                                 ? len
                                 : cost_cache_intervals[i].end);
    const int64_t cost = distance_cost + cost_cache_intervals[i].cost;

    for (; interval != NULL && interval->start < end;
         interval = interval_next) {
      interval_next = interval->next;

      // Make sure we have some overlap
      if (start >= interval->end) continue;

      if (cost >= interval->cost) {
        // When intervals are represented, the lower, the better.
        // [**********************************************************[
        // start                                                    end
        //                   [----------------------------------[
        //                   interval->start        interval->end
        // If we are worse than what we already have, add whatever we have so
        // far up to interval.
        const int start_new = interval->end;
        InsertInterval(manager, interval, cost, position, start,
                       interval->start);
        start = start_new;
        if (start >= end) break;
        continue;
      }

      if (start <= interval->start) {
        if (interval->end <= end) {
          //                   [----------------------------------[
          //                   interval->start        interval->end
          // [**************************************************************[
          // start                                                        end
          // We can safely remove the old interval as it is fully included.
          PopInterval(manager, interval);
        } else {
          //              [------------------------------------[
          //              interval->start          interval->end
          // [*****************************[
          // start                       end
          interval->start = end;
          break;
        }
      } else {
        if (end < interval->end) {
          // [--------------------------------------------------------------[
          // interval->start                                    interval->end
          //                     [*****************************[
          //                     start                       end
          // We have to split the old interval as it fully contains the new one.
          const int end_original = interval->end;
          interval->end = start;
          InsertInterval(manager, interval, interval->cost, interval->index,
                         end, end_original);
          interval = interval->next;
          break;
        } else {
          // [------------------------------------[
          // interval->start          interval->end
          //                     [*****************************[
          //                     start                       end
          interval->end = start;
        }
      }
    }
    // Insert the remaining interval from start to end.
    InsertInterval(manager, interval, cost, position, start, end);
  }
}